

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dielectric.hpp
# Opt level: O1

void __thiscall DielectricBRDF::sample_f(DielectricBRDF *this)

{
  vec3f *in_RCX;
  vec3f *in_RDX;
  Color *in_RSI;
  float *in_R8;
  Sampler *in_R9;
  
  sample_f((DielectricBRDF *)
           ((long)&(this->super_DiracBxDF)._vptr_DiracBxDF +
           (long)(this->super_DiracBxDF)._vptr_DiracBxDF[-4]),in_RSI,in_RDX,in_RCX,in_R8,in_R9);
  return;
}

Assistant:

Color sample_f(const Color& albedo, const vec3f& wo, vec3f& wi, float& pdf, Sampler& sampler) const override
	{
		float ior = wo.z>0? IOR: 1/IOR;
		float cost;
		float r = reflectivity(fabs(wo.z), cost, ior);

		if (r == 1 || sampler.get1f()<r) // reflected
		{
			wi = vec3f(-wo.x, -wo.y, wo.z);
			pdf = r;
			return r / fabs(wi.z);
		}
		else // transmitted
		{
			wi = vec3f(-wo.x/ior, -wo.y/ior, -wo.z * cost/fabs(wo.z));
			pdf = 1-r;
			return (1-r) / (fabs(wi.z) * ior * ior);
			// the 1/ior^2 coefficient is used to convert energy to radiance
			// see note_refract_radiance
		}
	}